

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O0

MppTimer mpp_timer_get(char *name)

{
  int iVar1;
  undefined1 local_34 [8];
  epoll_event event;
  MppTimerImpl *impl;
  RK_S32 epoll_fd;
  RK_S32 timer_fd;
  char *name_local;
  
  impl._4_4_ = -1;
  impl._0_4_ = -1;
  event.data.ptr = (void *)0x0;
  event.data.ptr = mpp_osal_calloc("mpp_timer_get",0x48);
  if (event.data.ptr == (void *)0x0) {
    _mpp_log_l(2,"mpp_time","malloc failed\n","mpp_timer_get");
  }
  else {
    impl._4_4_ = timerfd_create(0,0);
    if ((-1 < impl._4_4_) && (impl._0_4_ = epoll_create(1), -1 < (int)impl)) {
      memset(local_34,0,0xc);
      local_34._0_4_ = 0x80000001;
      local_34._4_4_ = impl._4_4_;
      iVar1 = epoll_ctl((int)impl,1,impl._4_4_,(epoll_event *)local_34);
      if (-1 < iVar1) {
        *(int *)(event.data.u64 + 0x24) = impl._4_4_;
        *(int *)(event.data.u64 + 0x28) = (int)impl;
        *(undefined4 *)(event.data.u64 + 0x1c) = 1000;
        *(undefined4 *)(event.data.u64 + 0x20) = 1000;
        *(char **)event.data.ptr = timer_name;
        snprintf((char *)(event.data.u64 + 8),0xf,name,0);
        return event.data.ptr;
      }
    }
  }
  _mpp_log_l(2,"mpp_time","failed to create timer\n","mpp_timer_get");
  if (event.data.ptr != (void *)0x0) {
    mpp_osal_free("mpp_timer_get",event.data.ptr);
    event.data.ptr = (void *)0x0;
  }
  if (-1 < impl._4_4_) {
    close(impl._4_4_);
  }
  if (-1 < (int)impl) {
    close((int)impl);
  }
  return (MppTimer)0x0;
}

Assistant:

MppTimer mpp_timer_get(const char *name)
{
    RK_S32 timer_fd = -1;
    RK_S32 epoll_fd = -1;
    MppTimerImpl *impl = NULL;

    do {
        struct epoll_event event;

        impl = mpp_calloc(MppTimerImpl, 1);
        if (NULL == impl) {
            mpp_err_f("malloc failed\n");
            break;
        }

        timer_fd = timerfd_create(CLOCK_REALTIME, 0);
        if (timer_fd < 0)
            break;

        epoll_fd = epoll_create(1);
        if (epoll_fd < 0)
            break;

        memset(&event, 0, sizeof(event));
        event.data.fd = timer_fd;
        event.events = EPOLLIN | EPOLLET;

        if (epoll_ctl(epoll_fd, EPOLL_CTL_ADD, timer_fd, &event) < 0)
            break;

        impl->timer_fd = timer_fd;
        impl->epoll_fd = epoll_fd;
        /* default 1 second (1000ms) looper */
        impl->initial  = 1000;
        impl->interval = 1000;
        impl->check = timer_name;
        snprintf(impl->name, sizeof(impl->name) - 1, name, NULL);

        return impl;
    } while (0);

    mpp_err_f("failed to create timer\n");

    if (impl) {
        mpp_free(impl);
        impl = NULL;
    }

    if (timer_fd >= 0) {
        close(timer_fd);
        timer_fd = -1;
    }

    if (epoll_fd >= 0) {
        close(epoll_fd);
        epoll_fd = -1;
    }

    return NULL;
}